

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::blueprint_helpers::parseFracSigOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  int iVar1;
  char16_t cVar2;
  int32_t iVar3;
  Precision local_80;
  Precision local_60;
  FractionPrecision *local_40;
  FractionPrecision *oldPrecision;
  int local_30;
  int maxSig;
  int minSig;
  int offset;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  _minSig = status;
  status_local = (UErrorCode *)macros;
  macros_local = (MacroProps *)segment;
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar2 == L'@') {
    maxSig = 0;
    local_30 = 0;
    while ((iVar1 = maxSig,
           iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local),
           iVar1 < iVar3 &&
           (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig),
           cVar2 == L'@'))) {
      local_30 = local_30 + 1;
      maxSig = maxSig + 1;
    }
    iVar1 = maxSig;
    iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
    if (iVar1 < iVar3) {
      cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig);
      if (cVar2 == L'+') {
        oldPrecision._4_4_ = -1;
        maxSig = maxSig + 1;
      }
      else {
        if (1 < local_30) {
          *_minSig = U_NUMBER_SKELETON_SYNTAX_ERROR;
          return false;
        }
        oldPrecision._4_4_ = local_30;
        while ((iVar1 = maxSig,
               iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local),
               iVar1 < iVar3 &&
               (cVar2 = numparse::impl::StringSegment::charAt((StringSegment *)macros_local,maxSig),
               cVar2 == L'#'))) {
          oldPrecision._4_4_ = oldPrecision._4_4_ + 1;
          maxSig = maxSig + 1;
        }
      }
      iVar1 = maxSig;
      iVar3 = numparse::impl::StringSegment::length((StringSegment *)macros_local);
      if (iVar1 < iVar3) {
        *_minSig = U_NUMBER_SKELETON_SYNTAX_ERROR;
        segment_local._7_1_ = false;
      }
      else {
        local_40 = (FractionPrecision *)(status_local + 0x10);
        if (oldPrecision._4_4_ == -1) {
          FractionPrecision::withMinDigits(&local_60,local_40,local_30);
          status_local[0x10] = local_60.fType;
          status_local[0x11] = local_60._4_4_;
          *(FractionSignificantSettings *)(status_local + 0x12) = local_60.fUnion.fracSig;
          *(undefined8 *)(status_local + 0x14) = local_60.fUnion._8_8_;
          status_local[0x16] = local_60.fRoundingMode;
        }
        else {
          FractionPrecision::withMaxDigits(&local_80,local_40,oldPrecision._4_4_);
          status_local[0x10] = local_80.fType;
          status_local[0x11] = local_80._4_4_;
          *(FractionSignificantSettings *)(status_local + 0x12) = local_80.fUnion.fracSig;
          *(undefined8 *)(status_local + 0x14) = local_80.fUnion._8_8_;
          status_local[0x16] = local_80.fRoundingMode;
        }
        segment_local._7_1_ = true;
      }
    }
    else {
      *_minSig = U_NUMBER_SKELETON_SYNTAX_ERROR;
      segment_local._7_1_ = false;
    }
  }
  else {
    segment_local._7_1_ = false;
  }
  return segment_local._7_1_;
}

Assistant:

bool blueprint_helpers::parseFracSigOption(const StringSegment& segment, MacroProps& macros,
                                           UErrorCode& status) {
    if (segment.charAt(0) != u'@') {
        return false;
    }
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    // For the frac-sig option, there must be minSig or maxSig but not both.
    // Valid: @+, @@+, @@@+
    // Valid: @#, @##, @###
    // Invalid: @, @@, @@@
    // Invalid: @@#, @@##, @@@#
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else if (minSig > 1) {
            // @@#, @@##, @@@#
            // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
            status = U_NUMBER_SKELETON_SYNTAX_ERROR;
            return false;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        // @, @@, @@@
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }

    auto& oldPrecision = static_cast<const FractionPrecision&>(macros.precision);
    if (maxSig == -1) {
        macros.precision = oldPrecision.withMinDigits(minSig);
    } else {
        macros.precision = oldPrecision.withMaxDigits(maxSig);
    }
    return true;
}